

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

mkv_timestamp_t MATROSKA_BlockTimestamp(matroska_block *Block)

{
  short sVar1;
  bool_t bVar2;
  ebml_context *Context;
  mkv_timestamp_t mVar3;
  mkv_timestamp_t mVar4;
  bool bVar5;
  double dVar6;
  matroska_cluster *local_20;
  ebml_element *Cluster;
  matroska_block *Block_local;
  
  bVar2 = Node_IsPartOf(Block,0x4c424b4d);
  if (bVar2 == 0) {
    __assert_fail("Node_IsPartOf(Block,MATROSKA_BLOCK_CLASS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x2a5,"mkv_timestamp_t MATROSKA_BlockTimestamp(matroska_block *)");
  }
  if (Block->GlobalTimestamp == 0x7fffffffffffffff) {
    if (Block->ReadTrack == (ebml_master *)0x0) {
      Block_local = (matroska_block *)0x7fffffffffffffff;
    }
    else {
      if (Block->LocalTimestampUsed == 0) {
        __assert_fail("Block->LocalTimestampUsed",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x2aa,"mkv_timestamp_t MATROSKA_BlockTimestamp(matroska_block *)");
      }
      local_20 = (matroska_cluster *)(Block->Base).Base.Base.Parent;
      while( true ) {
        bVar5 = false;
        if (local_20 != (matroska_cluster *)0x0) {
          Context = MATROSKA_getContextCluster();
          bVar2 = EBML_ElementIsType((ebml_element *)local_20,Context);
          bVar5 = bVar2 == 0;
        }
        if (!bVar5) break;
        local_20 = (matroska_cluster *)(local_20->Base).Base.Base.Parent;
      }
      if (local_20 == (matroska_cluster *)0x0) {
        Block_local = (matroska_block *)0x7fffffffffffffff;
      }
      else {
        mVar3 = MATROSKA_ClusterTimestamp(local_20);
        sVar1 = Block->LocalTimestamp;
        mVar4 = MATROSKA_SegmentInfoTimestampScale(Block->ReadSegInfo);
        dVar6 = MATROSKA_TrackTimestampScale(Block->ReadTrack);
        Block->GlobalTimestamp = mVar3 + (long)((double)(sVar1 * mVar4) * dVar6);
        mVar3 = Block->GlobalTimestamp;
        mVar4 = MATROSKA_ClusterTimestamp(local_20);
        MATROSKA_BlockSetTimestamp(Block,mVar3,mVar4);
        Block_local = (matroska_block *)Block->GlobalTimestamp;
      }
    }
  }
  else {
    Block_local = (matroska_block *)Block->GlobalTimestamp;
  }
  return (mkv_timestamp_t)Block_local;
}

Assistant:

mkv_timestamp_t MATROSKA_BlockTimestamp(matroska_block *Block)
{
    ebml_element *Cluster;
    assert(Node_IsPartOf(Block,MATROSKA_BLOCK_CLASS));
    if (Block->GlobalTimestamp!=INVALID_TIMESTAMP_T)
        return Block->GlobalTimestamp;
    if (Block->ReadTrack==NULL)
        return INVALID_TIMESTAMP_T;
    assert(Block->LocalTimestampUsed);
    Cluster = EBML_ElementParent(Block);
    while (Cluster && !EBML_ElementIsType(Cluster, MATROSKA_getContextCluster()))
        Cluster = EBML_ElementParent(Cluster);
    if (!Cluster)
        return INVALID_TIMESTAMP_T;
    Block->GlobalTimestamp = MATROSKA_ClusterTimestamp((matroska_cluster*)Cluster) + (mkv_timestamp_t)(Block->LocalTimestamp * MATROSKA_SegmentInfoTimestampScale(Block->ReadSegInfo) * MATROSKA_TrackTimestampScale(Block->ReadTrack));
    MATROSKA_BlockSetTimestamp(Block, Block->GlobalTimestamp, MATROSKA_ClusterTimestamp((matroska_cluster*)Cluster));
    return Block->GlobalTimestamp;
}